

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<float,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<float,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  data_ptr_t pdVar1;
  float *v_t;
  _func_int **pp_Var2;
  Vector *pVVar3;
  idx_t iVar4;
  reference q_00;
  FunctionData *pFVar5;
  uint64_t uVar6;
  unsigned_long *q;
  _func_int **pp_Var7;
  idx_t n;
  float fVar8;
  QuantileDirect<float> local_89;
  list_entry_t *local_88;
  FunctionData *local_80;
  AggregateFinalizeData *local_78;
  Vector *local_70;
  data_ptr_t local_68;
  vector<duckdb::QuantileValue,_true> *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    local_88 = target;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar5 = (this->bind_data).ptr;
    pVVar3 = ListVector::GetEntry(finalize_data->result);
    iVar4 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar5[2]._vptr_FunctionData - (long)pFVar5[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar4);
    pdVar1 = pVVar3->data;
    v_t = (state->v).super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    ;
    local_88->offset = iVar4;
    pp_Var7 = pFVar5[4]._vptr_FunctionData;
    pp_Var2 = pFVar5[5]._vptr_FunctionData;
    if (pp_Var7 != pp_Var2) {
      local_60 = (vector<duckdb::QuantileValue,_true> *)(pFVar5 + 1);
      local_68 = pdVar1 + iVar4 * 4;
      iVar4 = 0;
      local_80 = pFVar5;
      local_78 = finalize_data;
      local_70 = pVVar3;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_60,(size_type)*pp_Var7);
        n = (long)(state->v).super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)(state->v).super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2;
        local_58.desc = *(bool *)&local_80[7]._vptr_FunctionData;
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar4;
        local_58.end = n;
        fVar8 = Interpolator<true>::Operation<float,float,duckdb::QuantileDirect<float>>
                          (&local_58,v_t,local_70,&local_89);
        *(float *)(local_68 + (long)*pp_Var7 * 4) = fVar8;
        pp_Var7 = pp_Var7 + 1;
        iVar4 = local_58.FRN;
      } while (pp_Var7 != pp_Var2);
      iVar4 = local_88->offset;
      pFVar5 = local_80;
      finalize_data = local_78;
    }
    uVar6 = ((long)pFVar5[2]._vptr_FunctionData - (long)pFVar5[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    local_88->length = uVar6;
    ListVector::SetListSize(finalize_data->result,uVar6 + iVar4);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}